

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_math_lang.cpp
# Opt level: O1

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Omega_h::math_lang::get_variables_used
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *expr)

{
  SymbolSetReader reader;
  string local_248;
  storage_union local_228;
  long local_218;
  SymbolSetReader local_210;
  
  SymbolSetReader::SymbolSetReader(&local_210);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"get_variables_used","");
  Reader::read_string((any *)&local_228,&local_210.super_Reader,expr,&local_248);
  if (local_218 != 0) {
    (**(code **)(local_218 + 8))(&local_228);
    local_218 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&__return_storage_ptr__->_M_t,&local_210.variable_names._M_t);
  SymbolSetReader::~SymbolSetReader(&local_210);
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> get_variables_used(std::string const& expr) {
  SymbolSetReader reader;
  reader.read_string(expr, "get_variables_used");
  return reader.variable_names;
}